

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_libc.c
# Opt level: O1

err_t Read(filestream *p,void *Data,size_t Size,size_t *Readed)

{
  size_t sVar1;
  err_t eVar2;
  size_t sVar3;
  
  if (-1 < (long)Size) {
    sVar1 = read(p->fd,Data,Size);
    eVar2 = -0x15;
    if (-1 < (long)sVar1) {
      eVar2 = (ulong)(sVar1 == Size) * 9 + -9;
    }
    if (Readed != (size_t *)0x0) {
      sVar3 = 0;
      if (0 < (long)sVar1) {
        sVar3 = sVar1;
      }
      *Readed = sVar3;
    }
    return eVar2;
  }
  return -0x15;
}

Assistant:

static err_t Read(filestream* p,void* Data,size_t Size,size_t* Readed)
{
    if (Size > SSIZE_MAX)
        return ERR_READ;
    err_t Err;
    ssize_t n = read(p->fd, Data, Size);
    if (n<0)
    {
        n=0;
        Err = ERR_READ;
    }
    else
        Err = (n != (ssize_t)Size) ? ERR_END_OF_FILE:ERR_NONE;

    if (Readed)
        *Readed = n;
    return Err;
}